

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  cmSourceFile *this_00;
  pointer pbVar2;
  char *pcVar3;
  char *__s;
  char *__s_00;
  Value *pVVar4;
  string *psVar5;
  Value *pVVar6;
  ostream *poVar7;
  cmGeneratorTarget *pcVar8;
  Value *this_01;
  string *c;
  pointer pbVar9;
  string *li;
  pointer pbVar10;
  allocator<char> local_719;
  cmGeneratorTarget *local_718;
  cmGeneratorTarget *local_710;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directoryLabelsList;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeDirectoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string file;
  string json_file;
  string dir;
  Value lj_root;
  Value local_5d0;
  Value local_5a8;
  Value local_580;
  Value local_558;
  Value local_530;
  Value local_508;
  string local_4e0;
  cmGeneratedFileStream json_fout;
  cmGeneratedFileStream fout;
  
  local_718 = target;
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&dir,target);
  std::__cxx11::string::string((string *)&file,(string *)&dir);
  std::__cxx11::string::append((char *)&file);
  std::operator+(&json_file,&dir,"/Labels.json");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"LABELS",(allocator<char> *)&json_fout);
  pcVar8 = local_718;
  pcVar3 = cmGeneratorTarget::GetProperty(local_718,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = pcVar8->Target->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"LABELS",(allocator<char> *)&json_fout);
  __s = cmMakefile::GetProperty(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = *(cmMakefile **)(((ValueHolder *)&local_718->Target)->int_ + 0x198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_DIRECTORY_LABELS",(allocator<char> *)&json_fout);
  __s_00 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if ((pcVar3 == (char *)0x0 && __s == (char *)0x0) && __s_00 == (char *)0x0) {
    cmsys::SystemTools::RemoveFile(&file);
    cmsys::SystemTools::RemoveFile(&json_file);
  }
  else {
    Json::Value::Value(&lj_root,objectValue);
    Json::Value::Value(&local_558,objectValue);
    pVVar4 = Json::Value::operator[](&lj_root,"target");
    pVVar4 = Json::Value::operator=(pVVar4,&local_558);
    Json::Value::~Value(&local_558);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(local_718);
    Json::Value::Value(&local_580,psVar5);
    pVVar6 = Json::Value::operator[](pVVar4,"name");
    Json::Value::operator=(pVVar6,&local_580);
    Json::Value::~Value(&local_580);
    Json::Value::Value(&local_5a8,arrayValue);
    pVVar4 = Json::Value::operator[](pVVar4,"labels");
    local_710 = (cmGeneratorTarget *)Json::Value::operator=(pVVar4,&local_5a8);
    Json::Value::~Value(&local_5a8);
    Json::Value::Value(&local_5d0,arrayValue);
    pVVar4 = Json::Value::operator[](&lj_root,"sources");
    pVVar4 = Json::Value::operator=(pVVar4,&local_5d0);
    Json::Value::~Value(&local_5d0);
    cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,&file,false,None);
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&json_fout,pcVar3,(allocator<char> *)&directoryLabelsList);
      cmSystemTools::ExpandListArgument((string *)&json_fout,&labels,false);
      std::__cxx11::string::~string((string *)&json_fout);
      if (labels.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          labels.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<((ostream *)&fout,"# Target labels\n");
        pbVar10 = labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = labels.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar10;
            pbVar9 = pbVar9 + 1) {
          poVar7 = std::operator<<((ostream *)&fout," ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar9);
          std::operator<<(poVar7,"\n");
          Json::Value::Value((Value *)&json_fout,pbVar9);
          Json::Value::append((Value *)local_710,(Value *)&json_fout);
          Json::Value::~Value((Value *)&json_fout);
        }
      }
    }
    directoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmakeDirectoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    directoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    directoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmakeDirectoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cmakeDirectoryLabelsList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&json_fout,__s,(allocator<char> *)&sources);
      cmSystemTools::ExpandListArgument((string *)&json_fout,&directoryLabelsList,false);
      std::__cxx11::string::~string((string *)&json_fout);
    }
    if (__s_00 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&json_fout,__s_00,(allocator<char> *)&sources);
      cmSystemTools::ExpandListArgument((string *)&json_fout,&cmakeDirectoryLabelsList,false);
      std::__cxx11::string::~string((string *)&json_fout);
    }
    if ((directoryLabelsList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         directoryLabelsList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (pbVar10 = directoryLabelsList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       cmakeDirectoryLabelsList.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       cmakeDirectoryLabelsList.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      std::operator<<((ostream *)&fout,"# Directory labels\n");
      pbVar10 = directoryLabelsList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (pbVar9 = directoryLabelsList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = cmakeDirectoryLabelsList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pbVar9 != pbVar10; pbVar9 = pbVar9 + 1)
    {
      poVar7 = std::operator<<((ostream *)&fout," ");
      poVar7 = std::operator<<(poVar7,(string *)pbVar9);
      std::operator<<(poVar7,"\n");
      Json::Value::Value((Value *)&json_fout,pbVar9);
      Json::Value::append((Value *)local_710,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
    }
    for (pbVar10 = cmakeDirectoryLabelsList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
        pbVar10 = pbVar10 + 1) {
      poVar7 = std::operator<<((ostream *)&fout," ");
      poVar7 = std::operator<<(poVar7,(string *)pbVar10);
      std::operator<<(poVar7,"\n");
      Json::Value::Value((Value *)&json_fout,pbVar10);
      Json::Value::append((Value *)local_710,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
    }
    std::operator<<((ostream *)&fout,"# Source files and their labels\n");
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_4e0,local_718->Target->Makefile,&configs,true);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&configs);
    }
    pbVar10 = configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar10; pbVar9 = pbVar9 + 1)
    {
      cmGeneratorTarget::GetSourceFiles(local_718,&sources,pbVar9);
    }
    local_718 = (cmGeneratorTarget *)
                cmRemoveDuplicates<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                          (&sources);
    pcVar8 = (cmGeneratorTarget *)
             sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (pcVar8 != local_718) {
      this_00 = (cmSourceFile *)((ValueHolder *)&pcVar8->Target)->map_;
      local_710 = pcVar8;
      Json::Value::Value((Value *)&json_fout,objectValue);
      pVVar6 = Json::Value::append(pVVar4,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
      psVar5 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
      poVar7 = std::operator<<((ostream *)&fout,(string *)psVar5);
      std::operator<<(poVar7,"\n");
      Json::Value::Value(&local_508,psVar5);
      this_01 = Json::Value::operator[](pVVar6,"file");
      Json::Value::operator=(this_01,&local_508);
      Json::Value::~Value(&local_508);
      std::__cxx11::string::string<std::allocator<char>>((string *)&json_fout,"LABELS",&local_719);
      pcVar3 = cmSourceFile::GetProperty(this_00,(string *)&json_fout);
      std::__cxx11::string::~string((string *)&json_fout);
      if (pcVar3 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&labels);
        Json::Value::Value(&local_530,arrayValue);
        pVVar6 = Json::Value::operator[](pVVar6,"labels");
        pVVar6 = Json::Value::operator=(pVVar6,&local_530);
        Json::Value::~Value(&local_530);
        std::__cxx11::string::string<std::allocator<char>>((string *)&json_fout,pcVar3,&local_719);
        cmSystemTools::ExpandListArgument((string *)&json_fout,&labels,false);
        std::__cxx11::string::~string((string *)&json_fout);
        pbVar10 = labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = labels.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar10;
            pbVar9 = pbVar9 + 1) {
          poVar7 = std::operator<<((ostream *)&fout," ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar9);
          std::operator<<(poVar7,"\n");
          Json::Value::Value((Value *)&json_fout,pbVar9);
          Json::Value::append(pVVar6,(Value *)&json_fout);
          Json::Value::~Value((Value *)&json_fout);
        }
      }
      pcVar8 = (cmGeneratorTarget *)&local_710->Makefile;
    }
    cmGeneratedFileStream::cmGeneratedFileStream(&json_fout,&json_file,false,None);
    Json::operator<<((ostream *)&json_fout,&lj_root);
    cmGeneratedFileStream::~cmGeneratedFileStream(&json_fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cmakeDirectoryLabelsList);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&directoryLabelsList);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&labels);
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    Json::Value::~Value(&lj_root);
  }
  std::__cxx11::string::~string((string *)&json_file);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmGeneratorTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = dir;
  file += "/Labels.txt";
  std::string json_file = dir + "/Labels.json";

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Check whether labels are enabled for this target.
  const char* targetLabels = target->GetProperty("LABELS");
  const char* directoryLabels =
    target->Target->GetMakefile()->GetProperty("LABELS");
  const char* cmakeDirectoryLabels =
    target->Target->GetMakefile()->GetDefinition("CMAKE_DIRECTORY_LABELS");
  if (targetLabels || directoryLabels || cmakeDirectoryLabels) {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target = lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels = lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources = lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir);
    cmGeneratedFileStream fout(file);

    std::vector<std::string> labels;

    // List the target-wide labels.  All sources in the target get
    // these labels.
    if (targetLabels) {
      cmSystemTools::ExpandListArgument(targetLabels, labels);
      if (!labels.empty()) {
        fout << "# Target labels\n";
        for (std::string const& l : labels) {
          fout << " " << l << "\n";
          lj_target_labels.append(l);
        }
      }
    }

    // List directory labels
    std::vector<std::string> directoryLabelsList;
    std::vector<std::string> cmakeDirectoryLabelsList;

    if (directoryLabels) {
      cmSystemTools::ExpandListArgument(directoryLabels, directoryLabelsList);
    }

    if (cmakeDirectoryLabels) {
      cmSystemTools::ExpandListArgument(cmakeDirectoryLabels,
                                        cmakeDirectoryLabelsList);
    }

    if (!directoryLabelsList.empty() || !cmakeDirectoryLabelsList.empty()) {
      fout << "# Directory labels\n";
    }

    for (std::string const& li : directoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    for (std::string const& li : cmakeDirectoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> configs;
    target->Target->GetMakefile()->GetConfigurations(configs);
    if (configs.empty()) {
      configs.emplace_back();
    }
    for (std::string const& c : configs) {
      target->GetSourceFiles(sources, c);
    }
    std::vector<cmSourceFile*>::const_iterator sourcesEnd =
      cmRemoveDuplicates(sources);
    for (cmSourceFile* sf : cmMakeRange(sources.cbegin(), sourcesEnd)) {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      std::string const& sfp = sf->GetFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if (const char* svalue = sf->GetProperty("LABELS")) {
        labels.clear();
        Json::Value& lj_source_labels = lj_source["labels"] = Json::arrayValue;
        cmSystemTools::ExpandListArgument(svalue, labels);
        for (std::string const& label : labels) {
          fout << " " << label << "\n";
          lj_source_labels.append(label);
        }
      }
    }
    cmGeneratedFileStream json_fout(json_file);
    json_fout << lj_root;
  } else
#endif
  {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
  }
}